

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::init
          (MultipleBindingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  int iVar2;
  MessageBuilder *pMVar3;
  GLuint *value;
  MessageBuilder local_1a8;
  
  BindingRenderCase::init(&this->super_BindingRenderCase,ctx);
  local_1a8.m_log =
       ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = &local_1a8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Rendering ");
  std::ostream::operator<<(this_00,0x14);
  std::operator<<((ostream *)this_00,"x");
  std::ostream::operator<<(this_00,0x14);
  std::operator<<((ostream *)this_00," grid.\n");
  std::operator<<((ostream *)this_00,"Vertex positions:\n");
  std::operator<<((ostream *)this_00,"\tbinding point: 1\n");
  std::operator<<((ostream *)this_00,"Vertex offsets:\n");
  std::operator<<((ostream *)this_00,"\tbinding point: 2\n");
  std::operator<<((ostream *)this_00,"Vertex colors:\n");
  std::operator<<((ostream *)this_00,"\tbinding point: 2\n");
  std::operator<<((ostream *)this_00,"Binding point 1:\n");
  std::operator<<((ostream *)this_00,"\tbuffer object: ");
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,&this->m_primitiveBuf);
  poVar1 = &pMVar3->m_str;
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"Binding point 2:\n");
  std::operator<<((ostream *)poVar1,"\tbuffer object: ");
  value = &this->m_colorOffsetBuf;
  if ((this->m_spec).aliasingBuffers != false) {
    value = &this->m_primitiveBuf;
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,value);
  poVar1 = &pMVar3->m_str;
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\tinstance divisor: ");
  std::ostream::operator<<(poVar1,(uint)(this->m_spec).instanced);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\tstride: ");
  std::ostream::operator<<(poVar1,((this->m_spec).zeroStride ^ 1) << 5);
  std::operator<<((ostream *)poVar1,"\n");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return iVar2;
}

Assistant:

void MultipleBindingCase::init (void)
{
	BindingRenderCase::init();

	// log what we are trying to do

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Rendering " << (int)GRID_SIZE << "x" << (int)GRID_SIZE << " grid.\n"
						<< "Vertex positions:\n"
						<< "	binding point: 1\n"
						<< "Vertex offsets:\n"
						<< "	binding point: 2\n"
						<< "Vertex colors:\n"
						<< "	binding point: 2\n"
						<< "Binding point 1:\n"
						<< "	buffer object: " << m_primitiveBuf << "\n"
						<< "Binding point 2:\n"
						<< "	buffer object: " << ((m_spec.aliasingBuffers) ? (m_primitiveBuf) : (m_colorOffsetBuf)) << "\n"
						<< "	instance divisor: " << ((m_spec.instanced) ? (1) : (0)) << "\n"
						<< "	stride: " << ((m_spec.zeroStride) ? (0) : (4*4*2)) << "\n"
						<< tcu::TestLog::EndMessage;
}